

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_int128.cpp
# Opt level: O0

double __thiscall Omega_h::Int128::to_double(Int128 *this,double unit)

{
  undefined1 auVar1 [16];
  double local_1f0;
  double x;
  ulong uStack_188;
  Int128 tmp;
  double unit_local;
  Int128 *this_local;
  Int128 shifted;
  Int128 difference;
  
  uStack_188 = this->high;
  tmp.high = this->low;
  tmp.low = (uint64_t)unit;
  if (0x7fffffffffffffff < uStack_188) {
    tmp.high = -tmp.high;
    uStack_188 = -(ulong)(tmp.high != 0) - uStack_188;
  }
  for (; uStack_188 != 0; uStack_188 = (long)uStack_188 >> 1) {
    tmp.high = (ulong)tmp.high >> 1 | uStack_188 << 0x3f;
    tmp.low = (uint64_t)((double)tmp.low * 2.0);
  }
  auVar1._8_4_ = (int)((ulong)tmp.high >> 0x20);
  auVar1._0_8_ = tmp.high;
  auVar1._12_4_ = 0x45300000;
  local_1f0 = (auVar1._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)tmp.high) - 4503599627370496.0);
  if (0x7fffffffffffffff < (ulong)this->high) {
    local_1f0 = -local_1f0;
  }
  return (double)tmp.low * local_1f0;
}

Assistant:

double Int128::to_double(double unit) const {
  Int128 tmp = *this;
  if (tmp < Int128(0)) tmp = -tmp;
  while (tmp.high) {
    tmp = tmp >> 1;
    unit *= 2;
  }
  double x = tmp.low;
  if (*this < Int128(0)) x = -x;
  x *= unit;
  return x;
}